

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextAutomata.h
# Opt level: O2

int __thiscall bwtil::ContextAutomata::init(ContextAutomata *this,EVP_PKEY_CTX *ctx)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint i;
  int iVar6;
  uint uVar7;
  int extraout_EAX;
  ulint uVar8;
  ostream *poVar9;
  long lVar10;
  byte *pbVar11;
  ulong uVar12;
  int in_EDX;
  byte bVar13;
  ulong uVar14;
  reference rVar15;
  symbol s;
  allocator_type local_79;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  vector<bool,_std::allocator<bool>_> inserted;
  
  if (in_EDX != 0) {
    std::operator<<((ostream *)&std::cout,"\n*** Building context automata ***\n\n");
  }
  this->bwIt = (BackwardIterator *)ctx;
  uVar8 = (**(code **)(*(long *)ctx + 0x30))(ctx);
  this->n = uVar8;
  this->null_ptr = 0xffffffff;
  bVar13 = (byte)in_EDX;
  if (bVar13 != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout," Text length is ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&inserted,0x100,
             (allocator_type *)&local_78);
  pvVar1 = &this->remapping;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pvVar1,&inserted);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&inserted);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&inserted,0x100,
             (allocator_type *)&local_78);
  pvVar2 = &this->inverse_remapping;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(pvVar2,&inserted);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&inserted);
  for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
    (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar10] = 0x100;
    (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar10] = '\0';
  }
  local_60 = pvVar2;
  if (bVar13 != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n scanning file to detect alphabet ... ");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s = '\0';
  std::vector<bool,_std::allocator<bool>_>::vector(&inserted,0x100,(bool *)&s,&local_79);
  uVar12 = 0xffffffffffffffff;
  uVar14 = 0;
  while( true ) {
    iVar6 = (*this->bwIt->_vptr_BackwardIterator[4])();
    if ((char)iVar6 != '\0') {
      if (bVar13 != 0) {
        std::operator<<((ostream *)&std::cout," done.\n\n Sorting alphabet ... ");
        std::ostream::flush();
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (local_78._M_impl.super__Vector_impl_data._M_start,
                 local_78._M_impl.super__Vector_impl_data._M_finish);
      if (bVar13 != 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"done. Alphabet size: sigma = ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      this->sigma = 1;
      for (uVar7 = 0; uVar12 = (ulong)uVar7,
          uVar12 < (ulong)((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_78._M_impl.super__Vector_impl_data._M_start);
          uVar7 = uVar7 + 1) {
        pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
                             uVar12);
        if ((pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[*pbVar11] == 0x100) {
          uVar3 = this->sigma;
          pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
                               uVar12);
          (this->remapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[*pbVar11] = uVar3;
          this->sigma = this->sigma + 1;
        }
      }
      if (bVar13 != 0) {
        std::operator<<((ostream *)&std::cout,"\n Alphabet (ASCII codes) = { ");
      }
      for (uVar7 = 0;
          (ulong)uVar7 <
          (ulong)((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_78._M_impl.super__Vector_impl_data._M_start); uVar7 = uVar7 + 1) {
        if (bVar13 != 0) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,(ulong)uVar7
                    );
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::operator<<(poVar9,' ');
        }
      }
      if (bVar13 != 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"}");
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      this->TERMINATOR = '\0';
      for (lVar10 = 1; lVar10 != 0x100; lVar10 = lVar10 + 1) {
        uVar12 = (ulong)(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[lVar10];
        if (uVar12 != 0x100) {
          (local_60->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar12] = (uchar)lVar10;
        }
      }
      (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[this->TERMINATOR] = '\0';
      (*this->bwIt->_vptr_BackwardIterator[2])();
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&inserted.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
      return extraout_EAX;
    }
    uVar7 = (*this->bwIt->_vptr_BackwardIterator[3])();
    s = (symbol)uVar7;
    if (s == '\0') break;
    rVar15 = std::vector<bool,_std::allocator<bool>_>::at(&inserted,(ulong)(uVar7 & 0xff));
    if ((*rVar15._M_p & rVar15._M_mask) == 0) {
      rVar15 = std::vector<bool,_std::allocator<bool>_>::at(&inserted,(ulong)s);
      *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&s);
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->n;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar14;
    iVar6 = SUB164(auVar5 / auVar4,0);
    if (((int)uVar12 < iVar6 & bVar13 & iVar6 % 5 == 0) == 1) {
      poVar9 = std::operator<<((ostream *)&std::cout," ");
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar6);
      poVar9 = std::operator<<(poVar9,"% done.");
      std::endl<char,std::char_traits<char>>(poVar9);
      uVar12 = SUB168(auVar5 / auVar4,0) & 0xffffffff;
    }
    uVar14 = uVar14 + 100;
  }
  std::operator<<((ostream *)&std::cout,
                  "ERROR while reading input text : the text contains a 0x0 byte.\n");
  exit(0);
}

Assistant:

void init(BackwardIterator * bfr, bool verbose){

		if(verbose) cout << "\n*** Building context automata ***\n\n";

		bwIt = bfr;

		n = bwIt->length();
		null_ptr = ~((uint)0);

		if(verbose) cout << " Text length is " << n << endl;

		remapping = vector<uint>(256);
		inverse_remapping = vector<symbol>(256);

		for(uint i=0;i<256;i++){
			remapping[i]=empty;
			inverse_remapping[i]=0;
		}

		if(verbose) cout << "\n scanning file to detect alphabet ... " << endl;

		vector<symbol> alphabet = vector<symbol>();

		ulint symbols_read=0;
		vector<bool> inserted = vector<bool>(256,false);

		int perc,last_perc=-1;

		while(not bwIt->begin()){

			symbol s = bwIt->read();

			if(s==0){

				cout << "ERROR while reading input text : the text contains a 0x0 byte.\n";
				exit(0);

			}

			if(not inserted.at(s)){
				inserted.at(s) = true;
				alphabet.push_back(s);
			}

			perc = (100*symbols_read)/n;

			if(perc>last_perc and (perc%5)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}

			symbols_read++;

		}

		if(verbose) cout << " done.\n\n Sorting alphabet ... " << flush;

		std::sort(alphabet.begin(),alphabet.end());

		if(verbose) cout << "done. Alphabet size: sigma = " << alphabet.size() << endl;

		sigma = 1;//code 0x0 is for the terminator

		//if(verbose) cout << "\n Alphabet = { ";

		for (uint i=0;i<alphabet.size();i++){

			if(remapping[alphabet.at(i)]==empty){//new symbol

				remapping[alphabet.at(i)] = sigma;
				sigma++;

			}

			//if(verbose) cout << alphabet.at(i) << ' ';

		}

		//if(verbose) cout << "}\n\n";

		if(verbose) cout << "\n Alphabet (ASCII codes) = { ";

		for (uint i=0;i<alphabet.size();i++)
			if(verbose) cout << (ulint)alphabet.at(i) << ' ';

		if(verbose) cout << "}" << endl;

		TERMINATOR = 0;

		for(uint i=1;i<256;i++)
			if(remapping[i]!=empty)
				inverse_remapping[remapping[i]] = i;

		inverse_remapping[TERMINATOR] = 0;//0 is the terminator appended in the file

		bwIt->rewind();

	}